

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O2

ZyanStatus
ZydisFormatterATTFormatInstruction
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  byte bVar1;
  byte bVar2;
  ZyanStatus ZVar3;
  void *pvVar4;
  ZydisFormatterFunc *pp_Var5;
  uint uVar6;
  long lVar7;
  int iVar8;
  char *__assertion;
  ZydisDecodedOperand *pZVar9;
  void *state;
  int iVar10;
  ZydisDecorator ZStack_90;
  char local_38;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assertion = "formatter";
    uVar6 = 0x2e;
  }
  else if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assertion = "buffer";
    uVar6 = 0x2f;
  }
  else if (context == (ZydisFormatterContext *)0x0) {
    __assertion = "context";
    uVar6 = 0x30;
  }
  else if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assertion = "context->instruction";
    uVar6 = 0x31;
  }
  else {
    if (context->operands != (ZydisDecodedOperand *)0x0) {
      ZVar3 = (*formatter->func_print_prefixes)(formatter,buffer,context);
      if ((-1 < (int)ZVar3) &&
         (ZVar3 = (*formatter->func_print_mnemonic)(formatter,buffer,context), -1 < (int)ZVar3)) {
        if (buffer->is_token_list == '\0') {
          pvVar4 = (void *)(buffer->string).vector.size;
        }
        else {
          pvVar4 = (buffer->string).vector.data;
        }
        bVar1 = context->instruction->operand_count_visible;
        iVar10 = (int)(char)(bVar1 - 1);
        lVar7 = (ulong)(iVar10 + 1) * 0x50 + 0x20;
        for (iVar8 = 0; -1 < (char)(bVar1 + (char)iVar8 + -1); iVar8 = iVar8 + -1) {
          uVar6 = iVar8 + -1 + (uint)bVar1;
          pZVar9 = context->operands + (uVar6 & 0x7f);
          if ((((byte)((char)iVar8 + -2 + bVar1) == '\0') &&
              (pZVar9->type == ZYDIS_OPERAND_TYPE_REGISTER)) &&
             (pZVar9->encoding == ZYDIS_OPERAND_ENCODING_MASK)) goto LAB_00115a04;
          if (buffer->is_token_list == '\0') {
            state = (void *)(buffer->string).vector.size;
            if (state == pvVar4) {
              ZVar3 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_MNEMONIC);
              state = pvVar4;
            }
            else {
              ZVar3 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_OPERAND);
            }
          }
          else {
            state = (buffer->string).vector.data;
            if (pvVar4 == state) {
              ZVar3 = ZydisFormatterBufferAppendPredefined
                                (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_MNEMONIC);
              state = pvVar4;
            }
            else {
              ZVar3 = ZydisFormatterBufferAppendPredefined
                                (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_OPERAND);
            }
          }
          if ((int)ZVar3 < 0) {
            return ZVar3;
          }
          context->operand = pZVar9;
          if (formatter->func_pre_operand == (ZydisFormatterFunc)0x0) {
LAB_00115976:
            pp_Var5 = &formatter->func_format_operand_reg;
            switch(pZVar9->type) {
            case ZYDIS_OPERAND_TYPE_REGISTER:
              break;
            case ZYDIS_OPERAND_TYPE_MEMORY:
              pp_Var5 = &formatter->func_format_operand_mem;
              break;
            case ZYDIS_OPERAND_TYPE_POINTER:
              pp_Var5 = &formatter->func_format_operand_ptr;
              break;
            case ZYDIS_OPERAND_TYPE_IMMEDIATE:
              pp_Var5 = &formatter->func_format_operand_imm;
              break;
            default:
              return 0x80100004;
            }
            ZVar3 = (**pp_Var5)(formatter,buffer,context);
            if (ZVar3 == 0x20000b) goto LAB_001159ec;
            if ((int)ZVar3 < 0) {
              return ZVar3;
            }
            if (formatter->func_post_operand != (ZydisFormatterFunc)0x0) {
              ZVar3 = (*formatter->func_post_operand)(formatter,buffer,context);
              if (ZVar3 == 0x20000b) goto LAB_001159ec;
              if (-1 < (int)ZVar3) {
                return ZVar3;
              }
            }
            if ((context->instruction->encoding & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) ==
                ZYDIS_INSTRUCTION_ENCODING_EVEX) {
              local_38 = (char)uVar6;
              if (((local_38 == '\0') && (1 < context->instruction->operand_count_visible)) &&
                 ((context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK &&
                  (ZVar3 = (*formatter->func_print_decorator)
                                     (formatter,buffer,context,ZYDIS_DECORATOR_MASK), (int)ZVar3 < 0
                  )))) {
                return ZVar3;
              }
              if (pZVar9->type != ZYDIS_OPERAND_TYPE_MEMORY) {
                bVar2 = context->instruction->operand_count_visible;
                if (iVar10 + iVar8 == bVar2 - 1) {
                  if (pZVar9->type != ZYDIS_OPERAND_TYPE_IMMEDIATE) goto LAB_00115b0d;
                }
                else if ((iVar10 + iVar8 + 1 < (int)(uint)bVar2) &&
                        ((*(int *)(&context->operands->id + lVar7) == 4 ||
                         (*(int *)((long)context->operands + lVar7 + -0x1c) == 3)))) {
LAB_00115b0d:
                  if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) &&
                     (ZVar3 = (*formatter->func_print_decorator)
                                        (formatter,buffer,context,ZYDIS_DECORATOR_SWIZZLE),
                     (int)ZVar3 < 0)) {
                    return ZVar3;
                  }
                  ZVar3 = (*formatter->func_print_decorator)
                                    (formatter,buffer,context,ZYDIS_DECORATOR_RC);
                  if ((int)ZVar3 < 0) {
                    return ZVar3;
                  }
                  ZStack_90 = ZYDIS_DECORATOR_SAE;
                  goto LAB_00115b50;
                }
                goto LAB_00115a04;
              }
              ZVar3 = (*formatter->func_print_decorator)
                                (formatter,buffer,context,ZYDIS_DECORATOR_BC);
              if ((int)ZVar3 < 0) {
                return ZVar3;
              }
              if (context->instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE)
              goto LAB_00115a04;
              ZVar3 = (*formatter->func_print_decorator)
                                (formatter,buffer,context,ZYDIS_DECORATOR_CONVERSION);
              if ((int)ZVar3 < 0) {
                return ZVar3;
              }
              ZStack_90 = ZYDIS_DECORATOR_EH;
LAB_00115b50:
              ZVar3 = (*formatter->func_print_decorator)(formatter,buffer,context,ZStack_90);
              goto joined_r0x00115b5a;
            }
          }
          else {
            ZVar3 = (*formatter->func_pre_operand)(formatter,buffer,context);
            if (ZVar3 != 0x20000b) {
              if ((int)ZVar3 < 0) {
                return ZVar3;
              }
              goto LAB_00115976;
            }
LAB_001159ec:
            ZVar3 = ZydisFormatterBufferRestore(buffer,(ZyanUPointer)state);
joined_r0x00115b5a:
            if ((int)ZVar3 < 0) {
              return ZVar3;
            }
          }
LAB_00115a04:
          lVar7 = lVar7 + -0x50;
        }
        ZVar3 = 0x100000;
      }
      return ZVar3;
    }
    __assertion = "context->operands";
    uVar6 = 0x32;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                ,uVar6,
                "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
               );
}

Assistant:

ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    ZYAN_CHECK(formatter->func_print_prefixes(formatter, buffer, context));
    ZYAN_CHECK(formatter->func_print_mnemonic(formatter, buffer, context));

    ZyanUPointer state_mnemonic;
    ZYDIS_BUFFER_REMEMBER(buffer, state_mnemonic);

    const ZyanI8 c = (ZyanI8)context->instruction->operand_count_visible - 1;
    for (ZyanI8 i = c; i >= 0; --i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];

        // Print embedded-mask registers as decorator instead of a regular operand
        if ((i == 1) && (operand->type == ZYDIS_OPERAND_TYPE_REGISTER) &&
            (operand->encoding == ZYDIS_OPERAND_ENCODING_MASK))
        {
            continue;
        }

        ZyanUPointer buffer_state;
        ZYDIS_BUFFER_REMEMBER(buffer, buffer_state);

        if (buffer_state != state_mnemonic)
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_OPERAND);
        } else
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_MNEMONIC);
        }

        // Set current operand
        context->operand = operand;

        ZyanStatus status;
        if (formatter->func_pre_operand)
        {
            status = formatter->func_pre_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (!ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

        switch (operand->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            status = formatter->func_format_operand_reg(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            status = formatter->func_format_operand_mem(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            status = formatter->func_format_operand_ptr(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            status = formatter->func_format_operand_imm(formatter, buffer, context);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        if (status == ZYDIS_STATUS_SKIP_TOKEN)
        {
            ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
            continue;
        }
        if (!ZYAN_SUCCESS(status))
        {
            return status;
        }

        if (formatter->func_post_operand)
        {
            status = formatter->func_post_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
        if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
            (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX))
        {
            if  ((i == 0) && 
                (context->instruction->operand_count_visible > 1) && 
                (context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK))
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_MASK));
            }
            if (operand->type == ZYDIS_OPERAND_TYPE_MEMORY)
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_BC));
                if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                {
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_CONVERSION));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_EH));
                }
            } else
            {
                ZyanBool decorate_operand;
                if (i == (context->instruction->operand_count_visible - 1))
                {
                    decorate_operand = operand->type != ZYDIS_OPERAND_TYPE_IMMEDIATE;
                }
                else
                {
                    decorate_operand =
                        (context->instruction->operand_count_visible > (i + 1)) &&
                        ((context->operands[i + 1].type == ZYDIS_OPERAND_TYPE_IMMEDIATE) ||
                        (context->operands[i + 1].visibility == ZYDIS_OPERAND_VISIBILITY_HIDDEN));
                }
                if (decorate_operand)
                {
                    if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                    {
                        ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                            ZYDIS_DECORATOR_SWIZZLE));
                    }
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_RC));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_SAE));
                }
            }
        }
#endif
    }

    return ZYAN_STATUS_SUCCESS;
}